

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lisp2c.c
# Opt level: O0

void LispStringToCStr(LispPTR lispstring,char *cstring)

{
  LispPTR LVar1;
  LispPTR LVar2;
  LispPTR *pLVar3;
  DLword *pDVar4;
  int local_34;
  int Len;
  int i;
  short *sbase;
  char *base;
  OneDArray *arrayp;
  char *cstring_local;
  LispPTR lispstring_local;
  
  pLVar3 = NativeAligned4FromLAddr(lispstring);
  LVar1 = pLVar3[2];
  if (*(char *)((long)pLVar3 + 6) == 'C') {
    pDVar4 = NativeAligned2FromLAddr(*pLVar3 & 0xfffffff);
    LVar2 = pLVar3[1];
    for (local_34 = 0; local_34 < (int)LVar1; local_34 = local_34 + 1) {
      cstring[local_34] = *(char *)((long)pDVar4 + (long)local_34 + (long)(int)(uint)(ushort)LVar2);
    }
    cstring[(int)LVar1] = '\0';
  }
  else if (*(char *)((long)pLVar3 + 6) == 'D') {
    pDVar4 = NativeAligned2FromLAddr(*pLVar3 & 0xfffffff);
    LVar2 = pLVar3[1];
    for (local_34 = 0; SBORROW4(local_34,LVar1 * 2) != (int)(local_34 + LVar1 * -2) < 0;
        local_34 = local_34 + 1) {
      cstring[local_34] =
           *(char *)((long)pDVar4 + (long)local_34 + (long)(int)(uint)(ushort)LVar2 * 2);
    }
    cstring[(int)(LVar1 << 1)] = '\0';
  }
  else {
    error("Arg not Lisp string.\n");
  }
  return;
}

Assistant:

void LispStringToCStr(LispPTR lispstring, char *cstring) {
  OneDArray *arrayp;
  char *base;
  short *sbase;
  int i, Len;

  arrayp = (OneDArray *)(NativeAligned4FromLAddr(lispstring));
  Len = arrayp->fillpointer;

  switch (arrayp->typenumber) {
    case THIN_CHAR_TYPENUMBER:
      base = ((char *)(NativeAligned2FromLAddr(arrayp->base))) + ((int)(arrayp->offset));
      for (i = 0; i < Len; i++) cstring[i] = base[i];
      cstring[Len] = '\0';
      break;

    case FAT_CHAR_TYPENUMBER:
      sbase = ((short *)(NativeAligned2FromLAddr(arrayp->base))) + ((int)(arrayp->offset));
      base = (char *)sbase;
      for (i = 0; i < Len * 2; i++) cstring[i] = base[i];
      cstring[Len * 2] = '\0';
      break;

    default: error("Arg not Lisp string.\n");
  }
}